

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O1

char * mraa_file_unglob(char *filename)

{
  char *pcVar1;
  glob_t results;
  glob_t local_58;
  
  local_58.gl_pathc = 0;
  pcVar1 = (char *)0x0;
  glob(filename,0,(__errfunc *)0x0,&local_58);
  if (local_58.gl_pathc == 1) {
    pcVar1 = strdup(*local_58.gl_pathv);
  }
  globfree(&local_58);
  return pcVar1;
}

Assistant:

char*
mraa_file_unglob(const char* filename)
{
    glob_t results;
    char* res = NULL;
    results.gl_pathc = 0;
    glob(filename, 0, NULL, &results);
    if (results.gl_pathc == 1)
        res = strdup(results.gl_pathv[0]);
    globfree(&results);
    return res;
}